

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnector.cpp
# Opt level: O1

void hwnet::TCPConnector::connectTimeout(Ptr *t,Ptr *self)

{
  int iVar1;
  element_type *peVar2;
  Poller *this;
  int iVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar5;
  Ptr local_28;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)
                             &((self->
                               super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->mtx);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  peVar2 = (self->super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (peVar2->connectTimer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar3 = this_00->_M_use_count;
    do {
      if (iVar3 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar5 = iVar3 == iVar1;
      if (bVar5) {
        this_00->_M_use_count = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
    } while (!bVar5);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar5 = true;
  }
  else {
    bVar5 = this_00->_M_use_count == 0;
  }
  if (bVar5) {
    peVar4 = (element_type *)0x0;
  }
  else {
    peVar4 = (peVar2->connectTimer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  }
  if ((t->super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == peVar4) {
    bVar5 = ((self->super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            doing;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (bVar5 == false) {
      std::__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::reset
                (&(((self->super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->connectTimer).
                  super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>);
      peVar2 = (self->super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      peVar2->doing = true;
      peVar2->gotError = true;
      peVar2->err = 0x6e;
      pthread_mutex_unlock((pthread_mutex_t *)&peVar2->mtx);
      local_28.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &((self->super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_Task;
      this = ((element_type *)
             local_28.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->poller_;
      local_28.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (self->super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (local_28.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_28.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_28.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_28.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_28.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      Poller::PostTask(this,&local_28,(ThreadPool *)0x0);
      if (local_28.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_28.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      return;
    }
  }
  else if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pthread_mutex_unlock
            ((pthread_mutex_t *)
             &((self->super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              mtx);
  return;
}

Assistant:

void TCPConnector::connectTimeout(const util::Timer::Ptr &t,TCPConnector::Ptr self) {
	auto post = false;
	self->mtx.lock();
	if(t == self->connectTimer.lock() && !self->doing){
		self->connectTimer.reset();
		self->doing = true;
		post = true;
		self->gotError = true;
		self->err = ETIMEDOUT;
	}
	self->mtx.unlock();
	if(post) {
		self->poller_->PostTask(self);
	}	
}